

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void * tcmalloc::LowLevelAlloc::AllocWithArena(size_t request,Arena *arena)

{
  AllocList *pAVar1;
  int iVar2;
  Header *ptr;
  intptr_t iVar3;
  SpinLock *pSVar4;
  bool bVar5;
  pair<void_*,_unsigned_long> pVar6;
  AllocList *n;
  AllocList *prev [30];
  tuple<void*&,unsigned_long&> local_80 [16];
  pair<void_*,_unsigned_long> local_70;
  void *local_60;
  void *new_pages;
  size_t new_pages_size;
  AllocList *before;
  int i;
  size_t local_38;
  size_t req_rnd;
  SpinLockHolder locker;
  AllocList *s;
  Arena *arena_local;
  size_t request_local;
  
  if (request == 0) {
    return (void *)0x0;
  }
  s = (AllocList *)arena;
  if (arena == (Arena *)0x0) {
    s = (AllocList *)DefaultArena();
  }
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&req_rnd,(SpinLock *)s);
  local_38 = RoundUp(request + 0x20,(intptr_t)s[1].header.arena);
  do {
    iVar2 = LLA_SkiplistLevels(local_38,(size_t)s[1].header.dummy_for_alignment,false);
    before._0_4_ = iVar2 + -1;
    if ((int)before < *(int *)s->next) {
      pAVar1 = (AllocList *)&(s->header).magic;
      do {
        new_pages_size = (size_t)pAVar1;
        locker.lock_ = (SpinLock *)Next((int)before,(AllocList *)new_pages_size,(Arena *)s);
        bVar5 = false;
        if ((AllocList *)locker.lock_ != (AllocList *)0x0) {
          bVar5 = (ulong)(((AllocList *)locker.lock_)->header).size < local_38;
        }
        pAVar1 = (AllocList *)locker.lock_;
      } while (bVar5);
      if ((AllocList *)locker.lock_ != (AllocList *)0x0) {
        LLA_SkiplistDelete((AllocList *)&(s->header).magic,(AllocList *)locker.lock_,&n);
        if (local_38 + (long)s[1].header.dummy_for_alignment <= *(ulong *)locker.lock_) {
          ptr = (Header *)
                ((long)&((locker.lock_)->lockword_).super___atomic_base<int>._M_i + local_38);
          ptr->size = *(long *)locker.lock_ - local_38;
          iVar3 = Magic(0x4c833e95,ptr);
          ptr->magic = iVar3;
          ptr->arena = (Arena *)s;
          *(size_t *)locker.lock_ = local_38;
          AddToFreelist(ptr + 1,(Arena *)s);
        }
        iVar3 = Magic(0x4c833e95,(Header *)locker.lock_);
        *(intptr_t *)(locker.lock_ + 2) = iVar3;
        if (*(AllocList **)(locker.lock_ + 4) == s) {
          *(int *)&s[1].header.magic = (int)s[1].header.magic + 1;
          pSVar4 = locker.lock_ + 8;
          SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&req_rnd);
          return pSVar4;
        }
        syscall(1,2,"Check failed: s->header.arena == arena: \n",0x29);
        abort();
      }
    }
    SpinLock::Unlock((SpinLock *)s);
    new_pages = (void *)RoundUp(local_38,0x100000);
    pVar6 = (pair<void_*,_unsigned_long>)
            (**(code **)(**(long **)&s[1].levels + 0x10))(*(long **)&s[1].levels,new_pages);
    local_70 = pVar6;
    std::tie<void*,unsigned_long>((void **)local_80,(unsigned_long *)&local_60);
    std::tuple<void*&,unsigned_long&>::operator=(local_80,&local_70);
    SpinLock::Lock((SpinLock *)s);
    Arena::InsertAllocatedMemoryLocked((Arena *)s,local_60,(size_t)new_pages);
  } while( true );
}

Assistant:

void *LowLevelAlloc::AllocWithArena(size_t request, Arena *arena) {
  if (!request) {
    return nullptr;
  }

  if (!arena) {
    arena = DefaultArena();
  }

  AllocList *s;       // will point to region that satisfies request
  SpinLockHolder locker{&arena->mu};

  // round up with header
  size_t req_rnd = RoundUp(request + sizeof (s->header), arena->roundup);
  for (;;) {      // loop until we find a suitable region
    // find the minimum levels that a block of this size must have
    int i = LLA_SkiplistLevels(req_rnd, arena->min_size, false) - 1;
    if (i < arena->freelist.levels) {   // potential blocks exist
      AllocList *before = &arena->freelist;  // predecessor of s
      while ((s = Next(i, before, arena)) != 0 && s->header.size < req_rnd) {
        before = s;
      }
      if (s != 0) {       // we found a region
        break;
      }
    }
    // we unlock before mmap() both because mmap() may call a callback hook,
    // and because it may be slow.
    arena->mu.Unlock();

    size_t new_pages_size = RoundUp(req_rnd, kMinimalRegion);
    void *new_pages;
    std::tie(new_pages, new_pages_size) = arena->allocator->MapPages(new_pages_size);

    arena->mu.Lock();
    arena->InsertAllocatedMemoryLocked(new_pages, new_pages_size);
  }
  AllocList *prev[kMaxLevel];
  LLA_SkiplistDelete(&arena->freelist, s, prev);    // remove from free list
  // s points to the first free region that's big enough
  if (req_rnd + arena->min_size <= s->header.size) {  // big enough to split
    AllocList *n = reinterpret_cast<AllocList *>
      (req_rnd + reinterpret_cast<char *>(s));
    n->header.size = s->header.size - req_rnd;
    n->header.magic = Magic(kMagicAllocated, &n->header);
    n->header.arena = arena;
    s->header.size = req_rnd;
    AddToFreelist(&n->levels, arena);
  }
  s->header.magic = Magic(kMagicAllocated, &s->header);
  RAW_CHECK(s->header.arena == arena, "");
  arena->allocation_count++;

  return &s->levels;
}